

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

CATNDepartureSet<char> * __thiscall
Centaurus::CompositeATN<char>::build_departure_set
          (CATNDepartureSet<char> *__return_storage_ptr__,CompositeATN<char> *this,
          CATNClosure *closure)

{
  _Base_ptr p_Var1;
  ATNStateStack stack;
  CATNDepartureSetFactory<char> deptset_factory;
  ATNStateStack local_70;
  CATNDepartureSetFactory<char> local_50;
  
  local_50._vptr_CATNDepartureSetFactory = (_func_int **)&PTR__CATNDepartureSetFactory_00192bc8;
  local_50.m_departures.
  super__Vector_base<Centaurus::CATNDeparture<char>,_std::allocator<Centaurus::CATNDeparture<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_departures.
  super__Vector_base<Centaurus::CATNDeparture<char>,_std::allocator<Centaurus::CATNDeparture<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.m_departures.
  super__Vector_base<Centaurus::CATNDeparture<char>,_std::allocator<Centaurus::CATNDeparture<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._vptr_ATNPath = (_func_int **)&PTR__ATNPath_00192a48;
  for (p_Var1 = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(closure->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    build_departure_set_r
              (this,&local_50,(ATNPath *)(p_Var1 + 1),p_Var1[2]._M_color,
               (PriorityChain *)&p_Var1[2]._M_parent,&local_70);
  }
  CATNDepartureSetFactory<char>::build_departure_set(__return_storage_ptr__,&local_50);
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::~vector(&local_70.
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           );
  CATNDepartureSetFactory<char>::~CATNDepartureSetFactory(&local_50);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set(const CATNClosure& closure) const
    {
        CATNDepartureSetFactory<TCHAR> deptset_factory;

        ATNStateStack stack;

        for (const auto& p : closure)
        {
            build_departure_set_r(deptset_factory, p.path(), p.color(), p.priority(), stack);
        }

        return deptset_factory.build_departure_set();
    }